

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodings.h
# Opt level: O0

bool rapidjson::UTF8<char>::
     Validate<rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>::PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>>
               (GenericStringStream<rapidjson::UTF8<char>_> *is,
               PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
               *os)

{
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uchar local_21;
  bool result;
  Ch c;
  PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
  *os_local;
  GenericStringStream<rapidjson::UTF8<char>_> *is_local;
  
  local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  ::
  PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
  ::Put(os,local_21);
  if (((int)(char)local_21 & 0x80U) == 0) {
    is_local._7_1_ = true;
  }
  else {
    uVar1 = GetRange(local_21);
    switch(uVar1) {
    case '\x02':
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar2 = GetRange(local_21);
      is_local._7_1_ = (bVar2 & 0x70) != 0;
      break;
    case '\x03':
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar2 = GetRange(local_21);
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar3 = GetRange(local_21);
      is_local._7_1_ = (bVar2 & 0x70) != 0 && (bVar3 & 0x70) != 0;
      break;
    case '\x04':
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar2 = GetRange(local_21);
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar3 = GetRange(local_21);
      is_local._7_1_ = (bVar2 & 0x50) != 0 && (bVar3 & 0x70) != 0;
      break;
    case '\x05':
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar2 = GetRange(local_21);
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar3 = GetRange(local_21);
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar4 = GetRange(local_21);
      is_local._7_1_ = ((bVar2 & 0x10) != 0 && (bVar3 & 0x70) != 0) && (bVar4 & 0x70) != 0;
      break;
    case '\x06':
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar2 = GetRange(local_21);
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar3 = GetRange(local_21);
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar4 = GetRange(local_21);
      is_local._7_1_ = ((bVar2 & 0x70) != 0 && (bVar3 & 0x70) != 0) && (bVar4 & 0x70) != 0;
      break;
    default:
      is_local._7_1_ = false;
      break;
    case '\n':
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar2 = GetRange(local_21);
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar3 = GetRange(local_21);
      is_local._7_1_ = (bVar2 & 0x20) != 0 && (bVar3 & 0x70) != 0;
      break;
    case '\v':
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar2 = GetRange(local_21);
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar3 = GetRange(local_21);
      if (local_21 != '\0') {
        local_21 = GenericStringStream<rapidjson::UTF8<char>_>::Take(is);
        GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::
        PercentEncodeStream<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>_>
        ::Put(os,local_21);
      }
      bVar4 = GetRange(local_21);
      is_local._7_1_ = ((bVar2 & 0x60) != 0 && (bVar3 & 0x70) != 0) && (bVar4 & 0x70) != 0;
    }
  }
  return is_local._7_1_;
}

Assistant:

static bool Validate(InputStream& is, OutputStream& os) {
#define RAPIDJSON_COPY() if (c != '\0') os.Put(c = is.Take())
#define RAPIDJSON_TRANS(mask) result &= ((GetRange(static_cast<unsigned char>(c)) & mask) != 0)
#define RAPIDJSON_TAIL() RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x70)
        Ch c = static_cast<Ch>(-1);
        RAPIDJSON_COPY();
        if (!(c & 0x80))
            return true;

        bool result = true;
        switch (GetRange(static_cast<unsigned char>(c))) {
        case 2: RAPIDJSON_TAIL(); return result;
        case 3: RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        case 4: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x50); RAPIDJSON_TAIL(); return result;
        case 5: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x10); RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        case 6: RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        case 10: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x20); RAPIDJSON_TAIL(); return result;
        case 11: RAPIDJSON_COPY(); RAPIDJSON_TRANS(0x60); RAPIDJSON_TAIL(); RAPIDJSON_TAIL(); return result;
        default: return false;
        }
#undef RAPIDJSON_COPY
#undef RAPIDJSON_TRANS
#undef RAPIDJSON_TAIL
    }